

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QSslConfigurationPrivate>::reset
          (QExplicitlySharedDataPointer<QSslConfigurationPrivate> *this,
          QSslConfigurationPrivate *ptr)

{
  bool bVar1;
  QSslConfigurationPrivate *this_00;
  QSslConfigurationPrivate *in_RSI;
  long in_FS_OFFSET;
  QSslConfigurationPrivate *old;
  totally_ordered_wrapper<QSslConfigurationPrivate_*> *in_stack_ffffffffffffffb8;
  QSslConfigurationPrivate **in_stack_ffffffffffffffc0;
  totally_ordered_wrapper<QSslConfigurationPrivate_*> local_20;
  totally_ordered_wrapper<QSslConfigurationPrivate_*> local_18;
  QSslConfigurationPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = Qt::operator!=<QSslConfigurationPrivate_*,_true>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if (local_10 != (QSslConfigurationPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x3af38f);
    }
    Qt::totally_ordered_wrapper<QSslConfigurationPrivate_*>::totally_ordered_wrapper
              (&local_20,local_10);
    local_18 = std::
               exchange<Qt::totally_ordered_wrapper<QSslConfigurationPrivate*>,Qt::totally_ordered_wrapper<QSslConfigurationPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QSslConfigurationPrivate_*> *)0x3af3ad);
    this_00 = Qt::totally_ordered_wrapper<QSslConfigurationPrivate_*>::get(&local_18);
    if (((this_00 != (QSslConfigurationPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x3af3d3), !bVar1)) &&
       (this_00 != (QSslConfigurationPrivate *)0x0)) {
      QSslConfigurationPrivate::~QSslConfigurationPrivate(this_00);
      operator_delete(this_00,0x140);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }